

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Constant::jumping(Constant *this,int t,int f)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if ((t == 0) || (True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr != this)) {
    if ((f == 0) || (False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr != this))
    goto LAB_00111aab;
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"goto L",6);
    std::ostream::operator<<(local_198,f);
    std::__cxx11::stringbuf::str();
    Node::emit((Node *)this,&sStack_1e8);
    psVar1 = &sStack_1e8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"goto L",6);
    std::ostream::operator<<(local_198,t);
    std::__cxx11::stringbuf::str();
    Node::emit((Node *)this,&local_1c8);
    psVar1 = &local_1c8;
  }
  paVar2 = &psVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar2->_M_allocated_capacity)[-2] != paVar2) {
    operator_delete((undefined1 *)(&paVar2->_M_allocated_capacity)[-2],
                    paVar2->_M_allocated_capacity + 1);
  }
LAB_00111aab:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void jumping(int t, int f) override {
		std::stringstream ss;
		if (this == True.get() && t != 0) {
			ss << "goto L" << t;
			emit(ss.str());
		}
		else if (this == False.get() && f != 0) {
			ss << "goto L" << f;
			emit(ss.str());
		}
	}